

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uci.cpp
# Opt level: O0

void processUCI(void)

{
  bool bVar1;
  move mVar2;
  int depth_00;
  char *pcVar3;
  U64 UVar4;
  ostream *poVar5;
  string local_1000 [32];
  string local_fe0 [32];
  game local_fc0;
  move local_eab;
  move local_ea8;
  move bestMove;
  string local_ea0 [32];
  game local_e80;
  int local_d6c;
  move local_d68;
  int subnumber;
  undefined1 local_d60 [8];
  arrayMoveList moves;
  int number;
  int depth;
  string local_a30 [8];
  string token3_2;
  string local_a10 [32];
  string local_9f0 [8];
  string input3_2;
  string local_9d0 [32];
  string local_9b0 [8];
  string token2_1;
  string local_990 [32];
  string local_970 [8];
  string input2_1;
  game local_950;
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [8];
  string input4;
  game local_720;
  string local_610 [32];
  string local_5f0 [8];
  string token3_1;
  string local_5d0 [32];
  string local_5b0 [8];
  string input3_1;
  string local_590 [32];
  string local_570 [32];
  string local_550 [32];
  string local_530 [8];
  string token3;
  string local_510 [32];
  string local_4f0 [8];
  string input3;
  string local_4d0 [32];
  string local_4b0 [8];
  string token2;
  string local_490 [32];
  string local_470 [8];
  string input2;
  game local_450;
  game local_340;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  allocator local_1d9;
  string local_1d8 [39];
  allocator local_1b1;
  string local_1b0 [32];
  string local_190 [32];
  string local_170 [8];
  string token;
  string local_140 [8];
  string input;
  undefined1 local_120 [8];
  engineState state;
  
  engineState::engineState((engineState *)local_120);
  do {
    hearGUI_abi_cxx11_();
    std::__cxx11::string::string(local_190,local_140);
    getFirstToken(local_170);
    std::__cxx11::string::~string(local_190);
    bVar1 = std::operator==(local_170,"uci");
    if (bVar1) {
      local_120[0] = true;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1b0,"id name Valley",&local_1b1);
      tellGUI((string *)local_1b0);
      std::__cxx11::string::~string(local_1b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_1d8,"id author Tyler Behme",&local_1d9);
      tellGUI((string *)local_1d8);
      std::__cxx11::string::~string(local_1d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_1d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_200,"uciok",&local_201);
      tellGUI((string *)local_200);
      std::__cxx11::string::~string(local_200);
      std::allocator<char>::~allocator((allocator<char> *)&local_201);
LAB_0010bdfa:
      bVar1 = false;
    }
    else {
      bVar1 = std::operator==(local_170,"isready");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_228,"readyok",&local_229);
        tellGUI((string *)local_228);
        std::__cxx11::string::~string(local_228);
        std::allocator<char>::~allocator((allocator<char> *)&local_229);
        goto LAB_0010bdfa;
      }
      bVar1 = std::operator==(local_170,"debug");
      if (((bVar1) || (bVar1 = std::operator==(local_170,"setoption"), bVar1)) ||
         (bVar1 = std::operator==(local_170,"register"), bVar1)) goto LAB_0010bdfa;
      bVar1 = std::operator==(local_170,"ucinewgame");
      if (bVar1) {
        game::game(&local_340);
        game::operator=((game *)&state,&local_340);
        game::~game(&local_340);
        local_120[1] = true;
        goto LAB_0010bdfa;
      }
      bVar1 = std::operator==(local_170,"position");
      if (bVar1) {
        game::game(&local_450);
        game::operator=((game *)&state,&local_450);
        game::~game(&local_450);
        local_120[1] = true;
        std::__cxx11::string::string(local_490,local_140);
        removeFirstToken(local_470);
        std::__cxx11::string::~string(local_490);
        std::__cxx11::string::string(local_4d0,(string *)local_470);
        getFirstToken(local_4b0);
        std::__cxx11::string::~string(local_4d0);
        bVar1 = std::operator==(local_4b0,"startpos");
        if (bVar1) {
          std::__cxx11::string::string(local_510,(string *)local_470);
          removeFirstToken(local_4f0);
          std::__cxx11::string::~string(local_510);
          std::__cxx11::string::string(local_550,(string *)local_4f0);
          getFirstToken(local_530);
          std::__cxx11::string::~string(local_550);
          bVar1 = std::operator==(local_530,"moves");
          if (bVar1) {
            std::__cxx11::string::string(local_590,(string *)local_4f0);
            removeFirstToken(local_570);
            parseMovesIntoGame((game *)&state,local_570);
            std::__cxx11::string::~string((string *)local_570);
            std::__cxx11::string::~string(local_590);
          }
          std::__cxx11::string::~string((string *)local_530);
          std::__cxx11::string::~string((string *)local_4f0);
        }
        else {
          bVar1 = std::operator==(local_4b0,"fen");
          if (bVar1) {
            std::__cxx11::string::string(local_5d0,(string *)local_470);
            removeFirstToken(local_5b0);
            std::__cxx11::string::~string(local_5d0);
            std::__cxx11::string::string(local_610,(string *)local_5b0);
            getFirstToken(local_5f0);
            std::__cxx11::string::~string(local_610);
            pcVar3 = (char *)std::__cxx11::string::c_str();
            FENtoGame(&local_720,pcVar3);
            game::operator=((game *)&state,&local_720);
            game::~game(&local_720);
            std::__cxx11::string::string(local_740,(string *)local_5b0);
            while (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                            *)local_740,""), bVar1) {
              std::__cxx11::string::string(local_780,local_740);
              getFirstToken(local_760);
              bVar1 = std::operator==(local_760,"moves");
              std::__cxx11::string::~string((string *)local_760);
              std::__cxx11::string::~string(local_780);
              if (bVar1) {
                std::__cxx11::string::string(local_7c0,local_740);
                removeFirstToken(local_7a0);
                parseMovesIntoGame((game *)&state,local_7a0);
                std::__cxx11::string::~string((string *)local_7a0);
                std::__cxx11::string::~string(local_7c0);
                break;
              }
              std::__cxx11::string::string(local_800,local_740);
              removeFirstToken(local_7e0);
              std::__cxx11::string::operator=(local_740,(string *)local_7e0);
              std::__cxx11::string::~string((string *)local_7e0);
              std::__cxx11::string::~string(local_800);
            }
            std::__cxx11::string::~string(local_740);
            std::__cxx11::string::~string((string *)local_5f0);
            std::__cxx11::string::~string((string *)local_5b0);
          }
          else {
            bVar1 = std::operator==(local_4b0,"moves");
            if (bVar1) {
              std::__cxx11::string::string(local_840,(string *)local_470);
              removeFirstToken(local_820);
              parseMovesIntoGame((game *)&state,local_820);
              std::__cxx11::string::~string((string *)local_820);
              std::__cxx11::string::~string(local_840);
            }
          }
        }
        std::__cxx11::string::~string((string *)local_4b0);
        std::__cxx11::string::~string((string *)local_470);
        goto LAB_0010bdfa;
      }
      bVar1 = std::operator==(local_170,"go");
      if (bVar1) {
        if ((local_120[1] & 1U) == 0) {
          game::game(&local_950);
          game::operator=((game *)&state,&local_950);
          game::~game(&local_950);
          local_120[1] = true;
        }
        std::__cxx11::string::string(local_990,local_140);
        removeFirstToken(local_970);
        std::__cxx11::string::~string(local_990);
        std::__cxx11::string::string(local_9d0,(string *)local_970);
        getFirstToken(local_9b0);
        std::__cxx11::string::~string(local_9d0);
        bVar1 = std::operator==(local_9b0,"perft");
        if (bVar1) {
          std::__cxx11::string::string(local_a10,(string *)local_970);
          removeFirstToken(local_9f0);
          std::__cxx11::string::~string(local_a10);
          std::__cxx11::string::string((string *)&number,(string *)local_9f0);
          getFirstToken(local_a30);
          std::__cxx11::string::~string((string *)&number);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          moves.iteratorCount = atoi(pcVar3);
          moves.stackCount = 0;
          game::generateLegalMoves((arrayMoveList *)local_d60,(game *)&state);
          arrayMoveList::resetIterator((arrayMoveList *)local_d60);
          while (bVar1 = arrayMoveList::next((arrayMoveList *)local_d60), bVar1) {
            local_d68 = arrayMoveList::getMove((arrayMoveList *)local_d60);
            subnumber._1_2_ = local_d68._0_2_;
            subnumber._3_1_ = local_d68.special;
            game::makeMove((game *)&state,local_d68);
            depth_00 = moves.iteratorCount + -1;
            game::game(&local_e80,(game *)&state);
            UVar4 = Perft(depth_00,&local_e80);
            game::~game(&local_e80);
            moves.stackCount = moves.stackCount + (int)UVar4;
            local_d6c = (int)UVar4;
            mVar2 = arrayMoveList::getMove((arrayMoveList *)local_d60);
            local_ea8._0_2_ = mVar2._0_2_;
            local_ea8.special = mVar2.special;
            bestMove._0_2_ = local_ea8._0_2_;
            bestMove.special = local_ea8.special;
            moveToAlgebraic_abi_cxx11_(SUB83(local_ea0,0));
            poVar5 = std::operator<<((ostream *)&std::cout,local_ea0);
            poVar5 = std::operator<<(poVar5,": ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_d6c);
            std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_ea0);
            game::undoMove((game *)&state);
          }
          poVar5 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
          poVar5 = std::operator<<(poVar5,"Nodes searched: ");
          poVar5 = (ostream *)std::ostream::operator<<(poVar5,moves.stackCount);
          std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)local_a30);
          std::__cxx11::string::~string((string *)local_9f0);
        }
        else {
          move::move(&local_eab);
          game::game(&local_fc0,(game *)&state);
          evaluate(&local_fc0,&local_eab);
          game::~game(&local_fc0);
          moveToAlgebraic_abi_cxx11_(SUB83(local_1000,0));
          std::operator+((char *)local_fe0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         "bestmove ");
          tellGUI(local_fe0);
          std::__cxx11::string::~string((string *)local_fe0);
          std::__cxx11::string::~string(local_1000);
        }
        std::__cxx11::string::~string((string *)local_9b0);
        std::__cxx11::string::~string((string *)local_970);
        goto LAB_0010bdfa;
      }
      bVar1 = std::operator==(local_170,"stop");
      if (((bVar1) || (bVar1 = std::operator==(local_170,"ponderhit"), bVar1)) ||
         (bVar1 = std::operator==(local_170,"quit"), !bVar1)) goto LAB_0010bdfa;
      bVar1 = true;
    }
    std::__cxx11::string::~string((string *)local_170);
    std::__cxx11::string::~string(local_140);
    if (bVar1) {
      engineState::~engineState((engineState *)local_120);
      return;
    }
  } while( true );
}

Assistant:

void processUCI() {
  engineState state;

  while (true) {
    std::string input = hearGUI();
    std::string token = getFirstToken(input);

    if(token == "uci") {
      state.isUCI = true;
      tellGUI("id name Valley");
      tellGUI("id author Tyler Behme");
      tellGUI("uciok");
    }
    else if(token == "isready") {
      tellGUI("readyok");
    }
    else if(token == "debug") {

    }
    else if(token == "setoption") {

    }
    else if(token == "register") {

    }
    else if(token == "ucinewgame") {
      state.Game = game();
      state.inGame = true;
    }
    else if(token == "position") {
      state.Game = game();
      state.inGame = true;
      std::string input2 = removeFirstToken(input);
      std::string token2 = getFirstToken(input2);
      if(token2 == "startpos") {
        std::string input3 = removeFirstToken(input2);
        std::string token3 = getFirstToken(input3);

        if(token3 == "moves")
          parseMovesIntoGame(state.Game, removeFirstToken(input3));
      }
      else if(token2 == "fen") {
        std::string input3 = removeFirstToken(input2);
        std::string token3 = getFirstToken(input3);

        state.Game = FENtoGame(input3.c_str());

        std::string input4 = input3;
        while(input4 != "") { // Can be made safer than 'whiling' through
            if(getFirstToken(input4) == "moves") {
              parseMovesIntoGame(state.Game, removeFirstToken(input4));
              break;
            }
          input4 = removeFirstToken(input4);
        }
      }
      else if(token2 == "moves") {
        parseMovesIntoGame(state.Game, removeFirstToken(input2));
      }
    }
    else if(token == "go") {
      if(!state.inGame)
      {
        state.Game = game();
        state.inGame = true;
      }
      std::string input2 = removeFirstToken(input);
      std::string token2 = getFirstToken(input2);
      if(token2 == "perft") { // TODO: Implement checking for the depth
        std::string input3 = removeFirstToken(input2);
        std::string token3 = getFirstToken(input3);

        int depth = atoi(token3.c_str());
        int number = 0;

        arrayMoveList moves = state.Game.generateLegalMoves();
        moves.resetIterator();
        while(moves.next()) {
          state.Game.makeMove(moves.getMove());
          int subnumber = Perft(depth - 1, state.Game);
          number += subnumber;
          std::cout << moveToAlgebraic(moves.getMove()) << ": " << subnumber << std::endl;
          state.Game.undoMove();
        }
        std::cout << std::endl << "Nodes searched: " << number << std::endl;

      } else {
        move bestMove;
        evaluate(state.Game, bestMove);
        tellGUI("bestmove " + moveToAlgebraic(bestMove));
      }
    }
    else if(token == "stop") {

    }
    else if(token == "ponderhit") {

    }
    else if(token == "quit") {
      return;
    }
    else {
      // Implement checking second token later...
    }
  }
}